

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_encoding
pugi::impl::anon_unknown_0::get_buffer_encoding(xml_encoding encoding,void *contents,size_t size)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  bool bVar6;
  xml_encoding xVar7;
  xml_encoding xVar8;
  byte bVar9;
  uint8_t *enc;
  byte *local_28;
  size_t local_20;
  
  switch(encoding) {
  case encoding_auto:
    if (size < 4) {
      return encoding_utf8;
    }
    bVar1 = *contents;
    bVar2 = *(byte *)((long)contents + 1);
    cVar3 = *(char *)((long)contents + 2);
    cVar4 = *(char *)((long)contents + 3);
    if ((cVar3 == -2 && (bVar1 == 0 && bVar2 == 0)) && cVar4 == -1) {
      return encoding_utf32_be;
    }
    if ((((bVar2 ^ 0xfe) != 0 || bVar1 != 0xff) || cVar3 != '\0') || cVar4 != '\0') {
      if ((bVar2 ^ 0xfe) == 0 && bVar1 == 0xff || bVar2 == 0xff && bVar1 == 0xfe) {
        return (bVar2 == 0xff && bVar1 == 0xfe) | encoding_utf16_le;
      }
      if (cVar3 == -0x41 && (bVar2 == 0xbb && bVar1 == 0xef)) {
        return encoding_utf8;
      }
      if (((bVar1 == 0 && bVar2 == 0) && cVar3 == '\0') && cVar4 == '<') {
        return encoding_utf32_be;
      }
      bVar9 = bVar1 ^ 0x3c;
      if (((bVar9 == 0 && bVar2 == 0) && cVar3 == '\0') && cVar4 == '\0') {
        return encoding_utf32_le;
      }
      bVar5 = bVar2 ^ 0x3c;
      if (cVar4 == '?' && ((bVar1 == 0 && bVar5 == 0) && cVar3 == '\0')) {
        return encoding_utf16_be;
      }
      xVar8 = (bVar1 == 0 && bVar5 == 0) | encoding_utf16_le;
      xVar7 = encoding_utf16_le;
      if (cVar3 != '?' || cVar4 != '\0') {
        xVar7 = xVar8;
      }
      if (bVar9 != 0 || bVar2 != 0) {
        xVar7 = xVar8;
      }
      if (bVar9 == 0 && bVar2 == 0 || bVar1 == 0 && bVar5 == 0) {
        return xVar7;
      }
      local_28 = (byte *)0x0;
      local_20 = 0;
      if ((cVar4 == 'm' && (cVar3 == 'x' && (bVar9 == 0 && bVar2 == 0x3f))) &&
         (bVar6 = parse_declaration_encoding((uint8_t *)contents,size,&local_28,&local_20), bVar6))
      {
        if (local_20 == 6) {
          if ((*local_28 & 0xdf) != 0x4c) {
            return encoding_utf8;
          }
          if ((local_28[1] & 0xdf) != 0x41) {
            return encoding_utf8;
          }
          if ((local_28[2] & 0xdf) != 0x54) {
            return encoding_utf8;
          }
          if ((local_28[3] & 0xdf) != 0x49) {
            return encoding_utf8;
          }
          if ((local_28[4] & 0xdf) != 0x4e) {
            return encoding_utf8;
          }
          bVar1 = local_28[5];
        }
        else {
          if (local_20 != 10) {
            return encoding_utf8;
          }
          if ((*local_28 & 0xdf) != 0x49) {
            return encoding_utf8;
          }
          if ((local_28[1] & 0xdf) != 0x53) {
            return encoding_utf8;
          }
          if ((local_28[2] & 0xdf) != 0x4f) {
            return encoding_utf8;
          }
          if (local_28[3] != 0x2d) {
            return encoding_utf8;
          }
          if (local_28[4] != 0x38) {
            return encoding_utf8;
          }
          if (local_28[5] != 0x38) {
            return encoding_utf8;
          }
          if (local_28[6] != 0x35) {
            return encoding_utf8;
          }
          if (local_28[7] != 0x39) {
            return encoding_utf8;
          }
          if (local_28[8] != 0x2d) {
            return encoding_utf8;
          }
          bVar1 = local_28[9];
        }
        if (bVar1 == 0x31) {
          return encoding_latin1;
        }
      }
      return encoding_utf8;
    }
  case encoding_utf32:
  case encoding_wchar:
    encoding = encoding_utf32_le;
    break;
  case encoding_utf16:
    encoding = encoding_utf16_le;
  }
  return encoding;
}

Assistant:

PUGI__FN xml_encoding get_buffer_encoding(xml_encoding encoding, const void* contents, size_t size)
	{
		// replace wchar encoding with utf implementation
		if (encoding == encoding_wchar) return get_wchar_encoding();

		// replace utf16 encoding with utf16 with specific endianness
		if (encoding == encoding_utf16) return is_little_endian() ? encoding_utf16_le : encoding_utf16_be;

		// replace utf32 encoding with utf32 with specific endianness
		if (encoding == encoding_utf32) return is_little_endian() ? encoding_utf32_le : encoding_utf32_be;

		// only do autodetection if no explicit encoding is requested
		if (encoding != encoding_auto) return encoding;

		// try to guess encoding (based on XML specification, Appendix F.1)
		const uint8_t* data = static_cast<const uint8_t*>(contents);

		return guess_buffer_encoding(data, size);
	}